

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O0

TPZAutoPointer<TPZMatrix<double>_> __thiscall
TPZSTShiftOrigin<double>::CalcMatrix
          (TPZSTShiftOrigin<double> *this,TPZAutoPointer<TPZMatrix<double>_> *A)

{
  TPZBaseMatrix *this_00;
  TPZMatrix<double> *pTVar1;
  long lVar2;
  TPZMatrix<double> *pTVar3;
  TPZAutoPointer<TPZMatrix<double>_> *in_RDX;
  TPZSTShiftOrigin<double> *in_RSI;
  TPZReference *in_RDI;
  double extraout_XMM0_Qa;
  int i;
  double *shift;
  int64_t nRows;
  TPZAutoPointer<TPZMatrix<double>_> *shiftedMat;
  TPZAutoPointer<TPZMatrix<double>_> *in_stack_ffffffffffffff58;
  TPZAutoPointer<TPZMatrix<double>_> *in_stack_ffffffffffffff60;
  double local_58 [3];
  int local_3c;
  double local_38;
  double *local_30;
  undefined1 local_21;
  int64_t local_20;
  
  this_00 = &TPZAutoPointer<TPZMatrix<double>_>::operator->(in_RDX)->super_TPZBaseMatrix;
  local_20 = TPZBaseMatrix::Rows(this_00);
  local_21 = 0;
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_38 = Shift(in_RSI);
  local_30 = &local_38;
  for (local_3c = 0; local_3c < local_20; local_3c = local_3c + 1) {
    pTVar1 = TPZAutoPointer<TPZMatrix<double>_>::operator->
                       ((TPZAutoPointer<TPZMatrix<double>_> *)in_RDI);
    lVar2 = (long)local_3c;
    pTVar3 = TPZAutoPointer<TPZMatrix<double>_>::operator->
                       ((TPZAutoPointer<TPZMatrix<double>_> *)in_RDI);
    (*(pTVar3->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(pTVar3,(long)local_3c);
    local_58[0] = extraout_XMM0_Qa - *local_30;
    (*(pTVar1->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
              (pTVar1,lVar2,lVar2,local_58);
  }
  return (TPZAutoPointer<TPZMatrix<double>_>)in_RDI;
}

Assistant:

TPZAutoPointer<TPZMatrix<TVar>>
TPZSTShiftOrigin<TVar>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>A) const
{
  const auto nRows = A->Rows();
  TPZAutoPointer<TPZMatrix<TVar>> shiftedMat = A;
  //calculating A-sigmaB
  const auto &shift = Shift();
  for(int i = 0; i < nRows; i++) shiftedMat->PutVal(i,i,shiftedMat->GetVal(i,i)-shift);
  return shiftedMat;
}